

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O0

PSH_Globals_Funcs T1_Size_Get_Globals_Funcs(T1_Size size)

{
  long *plVar1;
  FT_Module pFVar2;
  PSH_Globals_Funcs local_30;
  FT_Module module;
  PSHinter_Service pshinter;
  T1_Face face;
  T1_Size size_local;
  
  plVar1 = *(long **)&(size->root).face[3].units_per_EM;
  pFVar2 = FT_Get_Module((((size->root).face)->driver->root).library,"pshinter");
  if (((pFVar2 == (FT_Module)0x0) || (plVar1 == (long *)0x0)) || (*plVar1 == 0)) {
    local_30 = (PSH_Globals_Funcs)0x0;
  }
  else {
    local_30 = (PSH_Globals_Funcs)(*(code *)*plVar1)(pFVar2);
  }
  return local_30;
}

Assistant:

static PSH_Globals_Funcs
  T1_Size_Get_Globals_Funcs( T1_Size  size )
  {
    T1_Face           face     = (T1_Face)size->root.face;
    PSHinter_Service  pshinter = (PSHinter_Service)face->pshinter;
    FT_Module         module;


    module = FT_Get_Module( size->root.face->driver->root.library,
                            "pshinter" );
    return ( module && pshinter && pshinter->get_globals_funcs )
           ? pshinter->get_globals_funcs( module )
           : 0;
  }